

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

string * __thiscall dns::Message::asString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  long lVar1;
  ostream *poVar2;
  pointer ppQVar3;
  pointer ppRVar4;
  ostringstream text;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"Header:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)local_1a8,"ID: ");
  lVar1 = *(long *)poVar2;
  *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) | 0x200;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffdff;
  poVar2 = std::operator<<((ostream *)local_1a8,"  fields: [ QR: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," opCode: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)local_1a8,"  QDcount: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)local_1a8,"  ANcount: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)local_1a8,"  NScount: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)local_1a8,"  ARcount: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((this->mQueries).super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->mQueries).super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    poVar2 = std::operator<<((ostream *)local_1a8,"Queries:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (ppQVar3 = (this->mQueries).
                   super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppQVar3 !=
        (this->mQueries).
        super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppQVar3 = ppQVar3 + 1) {
      poVar2 = std::operator<<((ostream *)local_1a8,"  ");
      QuerySection::asString_abi_cxx11_(&local_1c8,*ppQVar3);
      std::operator<<(poVar2,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
  }
  if ((this->mAnswers).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mAnswers).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    poVar2 = std::operator<<((ostream *)local_1a8,"Answers:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (ppRVar4 = (this->mAnswers).
                   super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppRVar4 !=
        (this->mAnswers).
        super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppRVar4 = ppRVar4 + 1) {
      poVar2 = std::operator<<((ostream *)local_1a8,"  ");
      ResourceRecord::asString_abi_cxx11_(&local_1c8,*ppRVar4);
      std::operator<<(poVar2,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
  }
  if ((this->mAuthorities).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mAuthorities).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    poVar2 = std::operator<<((ostream *)local_1a8,"Authorities:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (ppRVar4 = (this->mAuthorities).
                   super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppRVar4 !=
        (this->mAuthorities).
        super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppRVar4 = ppRVar4 + 1) {
      poVar2 = std::operator<<((ostream *)local_1a8,"  ");
      ResourceRecord::asString_abi_cxx11_(&local_1c8,*ppRVar4);
      std::operator<<(poVar2,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
  }
  if ((this->mAdditional).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mAdditional).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    poVar2 = std::operator<<((ostream *)local_1a8,"Additional:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (ppRVar4 = (this->mAdditional).
                   super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppRVar4 !=
        (this->mAdditional).
        super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppRVar4 = ppRVar4 + 1) {
      poVar2 = std::operator<<((ostream *)local_1a8,"  ");
      ResourceRecord::asString_abi_cxx11_(&local_1c8,*ppRVar4);
      std::operator<<(poVar2,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string Message::asString()
{
    ostringstream text;
    text << "Header:" << endl;
    text << "ID: " << showbase << hex << mId << endl << noshowbase;
    text << "  fields: [ QR: " << mQr << " opCode: " << mOpCode << " ]" << endl;
    text << "  QDcount: " << mQueries.size() << endl;
    text << "  ANcount: " << mAnswers.size() << endl;
    text << "  NScount: " << mAuthorities.size() << endl;
    text << "  ARcount: " << mAdditional.size() << endl;

    if (mQueries.size() > 0)
    {
        text << "Queries:" << endl;
        for(std::vector<QuerySection*>::iterator it = mQueries.begin(); it != mQueries.end(); ++it)
            text << "  " << (*it)->asString();
    }

    if (mAnswers.size() > 0)
    {
        text << "Answers:" << endl;
        for(std::vector<ResourceRecord*>::iterator it = mAnswers.begin(); it != mAnswers.end(); ++it)
            text << "  " << (*it)->asString();
    }

    if (mAuthorities.size() > 0)
    {
        text << "Authorities:" << endl;
        for(std::vector<ResourceRecord*>::iterator it = mAuthorities.begin(); it != mAuthorities.end(); ++it)
            text << "  " << (*it)->asString();
    }

    if (mAdditional.size() > 0)
    {
        text << "Additional:" << endl;
        for(std::vector<ResourceRecord*>::iterator it = mAdditional.begin(); it != mAdditional.end(); ++it)
            text << "  " << (*it)->asString();
    }


    return text.str();
}